

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Long FT_Get_CMap_Format(FT_CharMap charmap)

{
  FT_Driver pFVar1;
  FT_Module_Requester p_Var2;
  int iVar3;
  undefined8 *puVar4;
  FT_ULong FVar5;
  undefined1 local_28 [8];
  TT_CMapInfo cmap_info;
  
  FVar5 = 0xffffffffffffffff;
  if ((charmap != (FT_CharMap)0x0) && (charmap->face != (FT_Face)0x0)) {
    pFVar1 = charmap->face->driver;
    p_Var2 = ((pFVar1->root).clazz)->get_interface;
    if (p_Var2 == (FT_Module_Requester)0x0) {
      puVar4 = (undefined8 *)0x0;
    }
    else {
      puVar4 = (undefined8 *)(*p_Var2)(&pFVar1->root,"tt-cmaps");
    }
    if (puVar4 != (undefined8 *)0x0) {
      iVar3 = (*(code *)*puVar4)(charmap,local_28);
      if (iVar3 == 0) {
        FVar5 = cmap_info.language;
      }
    }
  }
  return FVar5;
}

Assistant:

FT_EXPORT_DEF( FT_Long )
  FT_Get_CMap_Format( FT_CharMap  charmap )
  {
    FT_Service_TTCMaps  service;
    FT_Face             face;
    TT_CMapInfo         cmap_info;


    if ( !charmap || !charmap->face )
      return -1;

    face = charmap->face;
    FT_FACE_FIND_SERVICE( face, service, TT_CMAP );
    if ( !service )
      return -1;
    if ( service->get_cmap_info( charmap, &cmap_info ))
      return -1;

    return cmap_info.format;
  }